

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointTriface.cpp
# Opt level: O2

void __thiscall chrono::fea::ChLinkPointTriface::ChLinkPointTriface(ChLinkPointTriface *this)

{
  double dVar1;
  
  ChLinkBase::ChLinkBase(&this->super_ChLinkBase);
  (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLinkPointTriface_011749a0;
  dVar1 = DAT_011dd3e0;
  (this->react).m_data[0] = VNULL;
  (this->react).m_data[1] = dVar1;
  (this->react).m_data[2] = DAT_011dd3e8;
  ChConstraintTwoTuples<chrono::fea::ChNodeFEAxyz,_chrono::fea::ChTriangleOfXYZnodes>::
  ChConstraintTwoTuples(&this->constraint1);
  ChConstraintTwoTuples<chrono::fea::ChNodeFEAxyz,_chrono::fea::ChTriangleOfXYZnodes>::
  ChConstraintTwoTuples(&this->constraint2);
  ChConstraintTwoTuples<chrono::fea::ChNodeFEAxyz,_chrono::fea::ChTriangleOfXYZnodes>::
  ChConstraintTwoTuples(&this->constraint3);
  (this->mnodeA).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->mnodeA).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mtriangle).super_ChVariableTupleCarrier_3vars<3,_3,_3>._vptr_ChVariableTupleCarrier_3vars =
       (_func_int **)&PTR__ChTriangleOfXYZnodes_01174e80;
  this->d = 0.0;
  *(undefined1 (*) [64])&(this->mtriangle).mnodeB1 = ZEXT464(0) << 0x40;
  return;
}

Assistant:

ChLinkPointTriface::ChLinkPointTriface() : react(VNULL), s2(0), s3(0), d(0) {}